

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Mesh::draw_vertex(Mesh *this,Vertex *v)

{
  ulong uVar1;
  
  uVar1 = (ulong)((Vertex *)(this->hoveredFeature).element == v) << 3 | 0xa0;
  if ((Vertex *)(this->selectedFeature).element == v) {
    uVar1 = 0xb0;
  }
  DrawStyle::style_vertex
            (*(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + uVar1));
  glBegin(0);
  glVertex3d((v->position).field_0.field_0.x,(v->position).field_0.field_0.y,
             (v->position).field_0.field_0.z);
  glEnd();
  uVar1 = (ulong)((Vertex *)(this->hoveredFeature).element == v) << 3 | 0xa0;
  if ((Vertex *)(this->selectedFeature).element == v) {
    uVar1 = 0xb0;
  }
  DrawStyle::style_reset
            (*(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + uVar1));
  return;
}

Assistant:

void Mesh::draw_vertex(const Vertex *v) const {
  get_draw_style(v)->style_vertex();
  glBegin(GL_POINTS);
  glVertex3d(v->position.x, v->position.y, v->position.z);
  glEnd();
  get_draw_style(v)->style_reset();
}